

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.h
# Opt level: O0

void __thiscall mvm::ip::increment(ip *this,uintptr_t inc)

{
  ulong uVar1;
  unsigned_long uVar2;
  mexcept *this_00;
  allocator<char> local_39;
  string local_38;
  uintptr_t local_18;
  uintptr_t inc_local;
  ip *this_local;
  
  uVar1 = this->m_val;
  local_18 = inc;
  inc_local = (uintptr_t)this;
  uVar2 = std::numeric_limits<unsigned_long>::max();
  if (uVar2 - local_18 < uVar1) {
    this_00 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"[-][mvm] bytecode overflow",&local_39);
    mexcept::mexcept(this_00,&local_38,CODE_OVERFLOW);
    __cxa_throw(this_00,&mexcept::typeinfo,mexcept::~mexcept);
  }
  this->m_val = local_18 + this->m_val;
  return;
}

Assistant:

void increment(uintptr_t inc) {
    if (m_val > (std::numeric_limits<uintptr_t>::max() - inc)) {
      throw mexcept{"[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW};
    }

    m_val += inc;
    LOG_INFO("ip -> update ip, (base, val) = (" << m_base << "," << m_val
                                                << ")");
  }